

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  int iVar1;
  char *pcVar2;
  char *zArg;
  char *pcStack_40;
  int i;
  char *zCat;
  Unicode61Tokenizer *p;
  int rc;
  Fts5Tokenizer **ppOut_local;
  int nArg_local;
  char **azArg_local;
  void *pUnused_local;
  
  p._4_4_ = 0;
  if (nArg % 2 == 0) {
    zCat = (char *)sqlite3_malloc(0xc0);
    if ((Unicode61Tokenizer *)zCat == (Unicode61Tokenizer *)0x0) {
      p._4_4_ = 7;
    }
    else {
      pcStack_40 = "L* N* Co";
      memset(zCat,0,0xc0);
      ((Unicode61Tokenizer *)zCat)->eRemoveDiacritic = 1;
      ((Unicode61Tokenizer *)zCat)->nFold = 0x40;
      pcVar2 = (char *)sqlite3_malloc64((long)((Unicode61Tokenizer *)zCat)->nFold);
      ((Unicode61Tokenizer *)zCat)->aFold = pcVar2;
      if (((Unicode61Tokenizer *)zCat)->aFold == (char *)0x0) {
        p._4_4_ = 7;
      }
      for (zArg._4_4_ = 0; p._4_4_ == 0 && zArg._4_4_ < nArg; zArg._4_4_ = zArg._4_4_ + 2) {
        iVar1 = sqlite3_stricmp(azArg[zArg._4_4_],"categories");
        if (iVar1 == 0) {
          pcStack_40 = azArg[zArg._4_4_ + 1];
        }
      }
      if (p._4_4_ == 0) {
        p._4_4_ = unicodeSetCategories((Unicode61Tokenizer *)zCat,pcStack_40);
      }
      for (zArg._4_4_ = 0; p._4_4_ == 0 && zArg._4_4_ < nArg; zArg._4_4_ = zArg._4_4_ + 2) {
        pcVar2 = azArg[zArg._4_4_ + 1];
        iVar1 = sqlite3_stricmp(azArg[zArg._4_4_],"remove_diacritics");
        if (iVar1 == 0) {
          if ((((*pcVar2 == '0') || (*pcVar2 == '1')) || (*pcVar2 == '2')) && (pcVar2[1] == '\0')) {
            ((Unicode61Tokenizer *)zCat)->eRemoveDiacritic = *pcVar2 + -0x30;
          }
          else {
            p._4_4_ = 1;
          }
        }
        else {
          iVar1 = sqlite3_stricmp(azArg[zArg._4_4_],"tokenchars");
          if (iVar1 == 0) {
            p._4_4_ = fts5UnicodeAddExceptions((Unicode61Tokenizer *)zCat,pcVar2,1);
          }
          else {
            iVar1 = sqlite3_stricmp(azArg[zArg._4_4_],"separators");
            if (iVar1 == 0) {
              p._4_4_ = fts5UnicodeAddExceptions((Unicode61Tokenizer *)zCat,pcVar2,0);
            }
            else {
              iVar1 = sqlite3_stricmp(azArg[zArg._4_4_],"categories");
              if (iVar1 != 0) {
                p._4_4_ = 1;
              }
            }
          }
        }
      }
    }
    if (p._4_4_ != 0) {
      fts5UnicodeDelete((Fts5Tokenizer *)zCat);
      zCat = (char *)0x0;
    }
    *ppOut = (Fts5Tokenizer *)zCat;
  }
  else {
    p._4_4_ = 1;
  }
  return p._4_4_;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */ 

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }

      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }

    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}